

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void standard_about_amulet_method_proc(Am_Object *param_1)

{
  bool bVar1;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Value dummy;
  Am_String local_30 [3];
  Am_Object local_18;
  Am_Object about_win;
  Am_Object *param_0_local;
  
  about_win.data = (Am_Object_Data *)param_1;
  Am_Get_About_Amulet_Window();
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    set_dialog_position(&local_18,-10000,-10000);
    Am_Value::Am_Value((Am_Value *)local_48);
    Am_Object::Am_Object(&local_50,&local_18);
    Am_Pop_Up_Window_And_Wait(&local_50,(Am_Value *)local_48,true);
    Am_Object::~Am_Object(&local_50);
    Am_Value::~Am_Value((Am_Value *)local_48);
  }
  else {
    Am_String::Am_String(local_30,"Can\'t find About Amulet Picture",true);
    Am_Show_Alert_Dialog(local_30,-10000,-10000,true);
    Am_String::~Am_String(local_30);
  }
  dummy.value.long_value._5_3_ = 0;
  dummy.value.long_value._4_1_ = !bVar1;
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_about_amulet_method,
                 (Am_Object /* cmd */))
{
  Am_Object about_win = Am_Get_About_Amulet_Window();
  if (!about_win.Valid()) {
    Am_Show_Alert_Dialog("Can't find About Amulet Picture");
    return;
  }
  set_dialog_position(about_win, Am_AT_CENTER_SCREEN, Am_AT_CENTER_SCREEN);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(about_win, dummy, true);
}